

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O1

char minijson::detail::read_unquoted_value<minijson::buffer_context>
               (buffer_context *context,char first_char)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  undefined8 *puVar4;
  char *in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  long lVar5;
  byte bVar6;
  int __fd;
  
  if (first_char == '\0') goto LAB_00107961;
  __fd = (int)first_char;
  do {
    buffer_context_base::write(&context->super_buffer_context_base,__fd,in_RDX,(size_t)in_RCX);
    in_RDX = extraout_RDX;
LAB_00107961:
    uVar1 = (context->super_buffer_context_base).m_read_offset;
    if (uVar1 < (context->super_buffer_context_base).m_length) {
      in_RCX = (context->super_buffer_context_base).m_read_buffer;
      in_RDX = (void *)(uVar1 + 1);
      (context->super_buffer_context_base).m_read_offset = (size_t)in_RDX;
      bVar6 = in_RCX[uVar1];
    }
    else {
      bVar6 = 0;
    }
    if (bVar6 < 0x5d) {
      if (bVar6 == 0x2c) goto LAB_001079ba;
      if (bVar6 == 0) goto LAB_001079cb;
    }
    else if ((bVar6 == 0x5d) || (bVar6 == 0x7d)) goto LAB_001079ba;
    __fd = (int)(char)bVar6;
    iVar3 = isspace(__fd);
    in_RDX = extraout_RDX_00;
  } while (iVar3 == 0);
  if (bVar6 == 0) {
LAB_001079cb:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
    *puVar4 = &PTR__exception_0010bd60;
    sVar2 = (context->super_buffer_context_base).m_read_offset;
    lVar5 = 0;
    if (sVar2 != 0) {
      lVar5 = sVar2 - 1;
    }
    puVar4[1] = lVar5;
    *(undefined4 *)(puVar4 + 2) = 7;
    __cxa_throw(puVar4,&parse_error::typeinfo,std::exception::~exception);
  }
LAB_001079ba:
  buffer_context_base::write(&context->super_buffer_context_base,0,in_RDX,(size_t)in_RCX);
  return bVar6;
}

Assistant:

char read_unquoted_value(Context& context, char first_char = 0)
{
    if (first_char != 0)
    {
        context.write(first_char);
    }

    char c;

    while (((c = context.read()) != 0) && (c != ',') && (c != '}') && (c != ']') && !isspace(c))
    {
        context.write(c);
    }

    if (c == 0)
    {
        throw parse_error(context, parse_error::UNTERMINATED_VALUE);
    }

    context.write(0);

    return c; // return the termination character (or it will be lost forever)
}